

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

int __thiscall
httplib::Stream::write_format<char_const*,char_const*>
          (Stream *this,char *fmt,char **args,char **args_1)

{
  pointer pvVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  long *in_RDI;
  vector<char,_std::allocator<char>_> glowable_buf;
  int n;
  array<char,_2048UL> buf;
  undefined4 in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff774;
  int iVar4;
  vector<char,_std::allocator<char>_> *this_00;
  undefined1 local_849 [29];
  int local_82c;
  array<char,_2048UL> local_828;
  undefined8 *local_28;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar1 = std::array<char,_2048UL>::data((array<char,_2048UL> *)0x1c52a1);
  sVar2 = std::array<char,_2048UL>::size(&local_828);
  local_4 = snprintf(pvVar1,sVar2 - 1,local_18,*local_20,*local_28);
  if (0 < local_4) {
    local_82c = local_4;
    sVar2 = std::array<char,_2048UL>::size(&local_828);
    if (local_4 < (int)sVar2 + -1) {
      pvVar1 = std::array<char,_2048UL>::data((array<char,_2048UL> *)0x1c5489);
      local_4 = (**(code **)(*in_RDI + 0x18))(in_RDI,pvVar1,(long)local_82c);
    }
    else {
      sVar2 = std::array<char,_2048UL>::size(&local_828);
      this_00 = (vector<char,_std::allocator<char>_> *)local_849;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (this_00,sVar2,
                 (allocator_type *)CONCAT44(in_stack_fffffffffffff774,in_stack_fffffffffffff770));
      std::allocator<char>::~allocator((allocator<char> *)local_849);
      while (iVar4 = local_82c,
            sVar2 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)(local_849 + 1)),
            (int)sVar2 + -1 <= iVar4) {
        sVar2 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)(local_849 + 1));
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)(local_849 + 1),sVar2 * 2);
        pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(local_849 + 1),0);
        sVar2 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)(local_849 + 1));
        local_82c = snprintf(pvVar3,sVar2 - 1,local_18,*local_20,*local_28);
      }
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(local_849 + 1),0);
      local_4 = (**(code **)(*in_RDI + 0x18))(in_RDI,pvVar3,(long)local_82c);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)(local_849 + 1));
    }
  }
  return local_4;
}

Assistant:

inline int Stream::write_format(const char *fmt, const Args &... args) {
  std::array<char, 2048> buf;

#if defined(_MSC_VER) && _MSC_VER < 1900
  auto n = _snprintf_s(buf, bufsiz, buf.size() - 1, fmt, args...);
#else
  auto n = snprintf(buf.data(), buf.size() - 1, fmt, args...);
#endif
  if (n <= 0) { return n; }

  if (n >= static_cast<int>(buf.size()) - 1) {
    std::vector<char> glowable_buf(buf.size());

    while (n >= static_cast<int>(glowable_buf.size() - 1)) {
      glowable_buf.resize(glowable_buf.size() * 2);
#if defined(_MSC_VER) && _MSC_VER < 1900
      n = _snprintf_s(&glowable_buf[0], glowable_buf.size(),
                      glowable_buf.size() - 1, fmt, args...);
#else
      n = snprintf(&glowable_buf[0], glowable_buf.size() - 1, fmt, args...);
#endif
    }
    return write(&glowable_buf[0], n);
  } else {
    return write(buf.data(), n);
  }
}